

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

quaternion * quaternion_lerp(quaternion *start,quaternion *end,double percent,quaternion *qR)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = -percent;
  if (-percent <= percent) {
    dVar2 = percent;
  }
  if (dVar2 < 1e-05) {
    dVar2 = (start->field_0).q[2];
    dVar3 = (start->field_0).q[3];
    dVar4 = (start->field_0).q[0];
    dVar5 = (start->field_0).q[1];
  }
  else {
    dVar3 = percent + -1.0;
    dVar2 = -dVar3;
    if (-dVar3 <= dVar3) {
      dVar2 = dVar3;
    }
    if (1e-05 <= dVar2) {
      dVar2 = 1.0 - percent;
      (qR->field_0).q[3] = (start->field_0).q[3] * dVar2 + (end->field_0).q[3] * percent;
      (qR->field_0).q[0] = (start->field_0).q[0] * dVar2 + (end->field_0).q[0] * percent;
      (qR->field_0).q[1] = (start->field_0).q[1] * dVar2 + (end->field_0).q[1] * percent;
      dVar3 = dVar2 * (start->field_0).q[2] + percent * (end->field_0).q[2];
      lVar1 = 0x10;
      goto LAB_0010cb78;
    }
    dVar2 = (end->field_0).q[2];
    dVar3 = (end->field_0).q[3];
    dVar4 = (end->field_0).q[0];
    dVar5 = (end->field_0).q[1];
  }
  (qR->field_0).q[0] = dVar4;
  (qR->field_0).q[1] = dVar5;
  (qR->field_0).q[2] = dVar2;
  lVar1 = 0x18;
LAB_0010cb78:
  *(double *)((long)&qR->field_0 + lVar1) = dVar3;
  return qR;
}

Assistant:

HYPAPI struct quaternion *quaternion_lerp(const struct quaternion *start, const struct quaternion *end, HYP_FLOAT percent, struct quaternion *qR)
{
	HYP_FLOAT f1, f2;

	/* if percent is 0, return start */
	if (scalar_equalsf(percent, 0.0f)) {
		quaternion_set(qR, start);
		return qR;
	}

	/* if percent is 1 return end */
	if (scalar_equalsf(percent, 1.0f)) {
		quaternion_set(qR, end);
		return qR;
	}

	f1 = 1.0f - percent;
	f2 = percent;

	/* this expanded form avoids calling quaternion_multiply and
	 * quaternion_add
	 */
	qR->w = f1 * start->w + f2 * end->w;
	qR->x = f1 * start->x + f2 * end->x;
	qR->y = f1 * start->y + f2 * end->y;
	qR->z = f1 * start->z + f2 * end->z;

	return qR;
}